

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O1

gboolean print_tree_entries(gpointer key,gpointer value,gpointer data)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < (int)data) {
    uVar2 = (ulong)data & 0xffffffff;
    do {
      putchar(0x20);
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  g_print("%s",*(undefined8 *)((long)key + 8));
  putchar(10);
  if (value != (gpointer)0x0) {
    g_tree_foreach(value,print_tree_entries,(long)((int)data + 2));
  }
  return 0;
}

Assistant:

static gboolean print_tree_entries(gpointer key,
                                   gpointer value,
                                   gpointer data)
{
    int i;
    for (i = 0; i < GPOINTER_TO_INT(data); ++i) {
        putchar(' ');
    }
    print_utf8_string(((struct filename_representations*) key)->display);
    putchar('\n');
    if (value) {
        g_tree_foreach((Filetree) value,
                       print_tree_entries,
                       GINT_TO_POINTER(GPOINTER_TO_INT(data) + 2));
    }
    return FALSE;
}